

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bp_decoder_ms.c
# Opt level: O0

void bp_setup_ms(mod2sparse *H,double error_prob,double *log_prob_ratios,char *decoding)

{
  int iVar1;
  long in_RDX;
  long in_RDI;
  double in_XMM0_Qa;
  int j;
  int N;
  mod2entry *e;
  int local_30;
  int *local_28;
  
  log_prob_ratio_initial = log((1.0 - in_XMM0_Qa) / in_XMM0_Qa);
  iVar1 = *(int *)(in_RDI + 4);
  for (local_30 = 0; local_30 < iVar1; local_30 = local_30 + 1) {
    for (local_28 = *(int **)(*(long *)(in_RDI + 0x10) + (long)local_30 * 0x38 + 0x20);
        -1 < *local_28; local_28 = *(int **)(local_28 + 8)) {
      *(double *)(local_28 + 10) = log_prob_ratio_initial;
      local_28[0xc] = 0;
      local_28[0xd] = 0x3ff00000;
    }
    *(undefined1 *)(in_RDX + local_30) = 0;
  }
  return;
}

Assistant:

void bp_setup_ms(mod2sparse *H,
    double error_prob,
    double *log_prob_ratios,
    char *decoding)
    {

  mod2entry *e;
  int N;
  int j;
  

  log_prob_ratio_initial=log((1-error_prob)/error_prob);
  N = mod2sparse_cols(H);

  for (j = 0; j<N; j++)
    { 
      for (e = mod2sparse_first_in_col(H,j);
            !mod2sparse_at_end(e);
            e = mod2sparse_next_in_col(e))
        { 
          e->pr = log_prob_ratio_initial;
          e->lr = 1;
        }
    // log_prob_ratios[j]=log_prob_ratio_initial;
    decoding[j]=0;
    }

}